

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

string * __thiscall
t_c_glib_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_c_glib_generator *this,t_type *ttype,bool in_typedef,
          bool is_const)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  t_program *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  t_c_glib_generator *ttype_00;
  runtime_error *this_01;
  t_c_glib_generator *ptVar4;
  allocator local_89;
  string pname;
  undefined1 local_68 [32];
  
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    paVar1 = &pname.field_2;
    if ((char)iVar3 == '\0') {
      this_00 = ttype->program_;
      if (this_00 == (t_program *)0x0) {
        std::__cxx11::string::string((string *)local_68,"",&local_89);
      }
      else {
        std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,"c_glib",&local_89);
        t_program::get_namespace((string *)local_68,this_00,(string *)&stack0xffffffffffffffb8);
      }
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      std::operator+(&pname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar3));
      ptVar4 = (t_c_glib_generator *)local_68;
      std::__cxx11::string::~string((string *)ptVar4);
      if (this_00 != (t_program *)0x0) {
        ptVar4 = (t_c_glib_generator *)&stack0xffffffffffffffb8;
        std::__cxx11::string::~string((string *)ptVar4);
      }
      bVar2 = is_complex_type(ptVar4,ttype);
      if (bVar2) {
        std::__cxx11::string::append((char *)&pname);
      }
      if (is_const) {
        std::operator+(__return_storage_ptr__,"const ",&pname);
        goto LAB_001409f0;
      }
    }
    else {
      pname._M_string_length = 0;
      pname.field_2._M_local_buf[0] = '\0';
      pname._M_dataplus._M_p = (pointer)paVar1;
      if (ttype[1].super_t_doc.doc_.field_2._M_local_buf[8] == '\x01') {
        std::__cxx11::string::string((string *)local_68,(string *)(ttype + 1));
        std::__cxx11::string::operator=((string *)&pname,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
      }
      else {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
        if (((char)iVar3 == '\0') &&
           (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype), (char)iVar3 == '\0')) {
          iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
          if ((char)iVar3 != '\0') {
            ttype_00 = (t_c_glib_generator *)
                       t_type::get_true_type(*(t_type **)&ttype[1].super_t_doc.has_doc_);
            ptVar4 = ttype_00;
            iVar3 = (*(ttype_00->super_t_oop_generator).super_t_generator._vptr_t_generator[4])();
            if ((char)iVar3 != '\0') {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_01,"compiler error: list element type cannot be void");
              __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            is_numeric(ptVar4,(t_type *)ttype_00);
            std::__cxx11::string::assign((char *)&pname);
          }
        }
        else {
          std::__cxx11::string::assign((char *)&pname);
        }
      }
      if (!in_typedef) {
        std::__cxx11::string::append((char *)&pname);
      }
      if (is_const) {
        std::operator+(__return_storage_ptr__,"const ",&pname);
        goto LAB_001409f0;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pname._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(pname.field_2._M_allocated_capacity._1_7_,pname.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = pname.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pname._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(pname.field_2._M_allocated_capacity._1_7_,pname.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = pname._M_string_length;
  }
  else {
    base_type_name_abi_cxx11_(&pname,this,ttype);
    if (is_const) {
      std::operator+(__return_storage_ptr__,"const ",&pname);
      goto LAB_001409f0;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pname._M_dataplus._M_p == &pname.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(pname.field_2._M_allocated_capacity._1_7_,pname.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = pname.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pname._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(pname.field_2._M_allocated_capacity._1_7_,pname.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = pname._M_string_length;
  }
  pname._M_dataplus._M_p = (pointer)&pname.field_2;
  pname._M_string_length = 0;
  pname.field_2._M_local_buf[0] = '\0';
LAB_001409f0:
  std::__cxx11::string::~string((string *)&pname);
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::type_name(t_type* ttype, bool in_typedef, bool is_const) {
  if (ttype->is_base_type()) {
    string bname = base_type_name(ttype);

    if (is_const) {
      return "const " + bname;
    } else {
      return bname;
    }
  }

  if (ttype->is_container()) {
    string cname;

    t_container* tcontainer = (t_container*)ttype;
    if (tcontainer->has_cpp_name()) {
      cname = tcontainer->get_cpp_name();
    } else if (ttype->is_map()) {
      cname = "GHashTable";
    } else if (ttype->is_set()) {
      // since a set requires unique elements, use a GHashTable, and
      // populate the keys and values with the same data, using keys for
      // the actual writes and reads.
      // TODO: discuss whether or not to implement TSet, THashSet or GHashSet
      cname = "GHashTable";
    } else if (ttype->is_list()) {
      t_type* etype = get_true_type(((t_list*)ttype)->get_elem_type());
      if (etype->is_void()) {
        throw std::runtime_error("compiler error: list element type cannot be void");
      }
      // TODO: investigate other implementations besides GPtrArray
      cname = is_numeric(etype) ? "GArray" : "GPtrArray";
    }

    /* Omit the dereference operator if we are aliasing this type within a
       typedef, to allow the type to be used more naturally in client code;
       otherwise, include it */
    if (!in_typedef) {
      cname += " *";
    }

    if (is_const) {
      return "const " + cname;
    } else {
      return cname;
    }
  }

  // check for a namespace
  t_program* tprogram = ttype->get_program();
  string pname = (tprogram ? tprogram->get_namespace("c_glib") : "") + ttype->get_name();

  if (is_complex_type(ttype)) {
    pname += " *";
  }

  if (is_const) {
    return "const " + pname;
  } else {
    return pname;
  }
}